

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O3

string * duckdb::Bit::NumericToBit<bool>(string *__return_storage_ptr__,bool numeric)

{
  char *pcVar1;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_20.pointer.length = 2;
  local_20.pointer.prefix[0] = '\0';
  local_20._6_2_ = 0;
  local_20._8_4_ = 0;
  local_20._12_4_ = 0;
  local_20.pointer.prefix[1] = numeric;
  Finalize((bitstring_t *)&local_20.pointer);
  if ((ulong)local_20.pointer.length < 0xd) {
    pcVar1 = local_20.pointer.prefix;
  }
  else {
    pcVar1 = (char *)CONCAT44(local_20._12_4_,local_20._8_4_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + local_20.pointer.length);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}